

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O1

t_int * times_perf8(t_int *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  t_int tVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  
  tVar15 = w[4];
  if ((int)tVar15 != 0) {
    lVar16 = w[3];
    lVar17 = w[1];
    lVar18 = w[2];
    lVar19 = 0;
    do {
      fVar1 = *(float *)(lVar17 + 4 + lVar19 * 4);
      fVar2 = *(float *)(lVar17 + 8 + lVar19 * 4);
      fVar3 = *(float *)(lVar17 + 0xc + lVar19 * 4);
      fVar4 = *(float *)(lVar17 + 0x10 + lVar19 * 4);
      fVar5 = *(float *)(lVar17 + 0x14 + lVar19 * 4);
      fVar6 = *(float *)(lVar17 + 0x18 + lVar19 * 4);
      fVar7 = *(float *)(lVar17 + 0x1c + lVar19 * 4);
      fVar8 = *(float *)(lVar18 + 4 + lVar19 * 4);
      fVar9 = *(float *)(lVar18 + 8 + lVar19 * 4);
      fVar10 = *(float *)(lVar18 + 0xc + lVar19 * 4);
      fVar11 = *(float *)(lVar18 + 0x10 + lVar19 * 4);
      fVar12 = *(float *)(lVar18 + 0x14 + lVar19 * 4);
      fVar13 = *(float *)(lVar18 + 0x18 + lVar19 * 4);
      fVar14 = *(float *)(lVar18 + 0x1c + lVar19 * 4);
      *(float *)(lVar16 + lVar19 * 4) =
           *(float *)(lVar17 + lVar19 * 4) * *(float *)(lVar18 + lVar19 * 4);
      *(float *)(lVar16 + 4 + lVar19 * 4) = fVar1 * fVar8;
      *(float *)(lVar16 + 8 + lVar19 * 4) = fVar2 * fVar9;
      *(float *)(lVar16 + 0xc + lVar19 * 4) = fVar3 * fVar10;
      *(float *)(lVar16 + 0x10 + lVar19 * 4) = fVar4 * fVar11;
      *(float *)(lVar16 + 0x14 + lVar19 * 4) = fVar5 * fVar12;
      *(float *)(lVar16 + 0x18 + lVar19 * 4) = fVar6 * fVar13;
      *(float *)(lVar16 + 0x1c + lVar19 * 4) = fVar7 * fVar14;
      lVar19 = lVar19 + 8;
    } while ((int)tVar15 != (int)lVar19);
  }
  return w + 5;
}

Assistant:

t_int *times_perf8(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    for (; n; n -= 8, in1 += 8, in2 += 8, out += 8)
    {
        t_sample f0 = in1[0], f1 = in1[1], f2 = in1[2], f3 = in1[3];
        t_sample f4 = in1[4], f5 = in1[5], f6 = in1[6], f7 = in1[7];

        t_sample g0 = in2[0], g1 = in2[1], g2 = in2[2], g3 = in2[3];
        t_sample g4 = in2[4], g5 = in2[5], g6 = in2[6], g7 = in2[7];

        out[0] = f0 * g0; out[1] = f1 * g1; out[2] = f2 * g2; out[3] = f3 * g3;
        out[4] = f4 * g4; out[5] = f5 * g5; out[6] = f6 * g6; out[7] = f7 * g7;
    }
    return (w+5);
}